

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O3

void mpack_read_native(mpack_reader_t *reader,char *p,size_t count)

{
  if ((ulong)((long)reader->end - (long)reader->data) < count) {
    mpack_read_native_straddle(reader,p,count);
    return;
  }
  memcpy(p,reader->data,count);
  reader->data = reader->data + count;
  return;
}

Assistant:

MPACK_INLINE void mpack_read_native(mpack_reader_t* reader, char* p, size_t count) {
    mpack_assert(count == 0 || p != NULL, "data pointer for %i bytes is NULL", (int)count);

    if (count > (size_t)(reader->end - reader->data)) {
        mpack_read_native_straddle(reader, p, count);
    } else {
        mpack_memcpy(p, reader->data, count);
        reader->data += count;
    }
}